

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void bitset_container_printf_as_uint32_array(bitset_container_t *v,uint32_t base)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char *__format;
  ulong uVar4;
  
  bVar3 = true;
  lVar2 = 0;
  do {
    for (uVar4 = v->words[lVar2]; uVar4 != 0; uVar4 = uVar4 & uVar4 - 1) {
      lVar1 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      __format = ",%u";
      if (bVar3) {
        __format = "%u";
        bVar3 = false;
      }
      printf(__format,(ulong)((int)lVar1 + base));
    }
    base = base + 0x40;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x400);
  return;
}

Assistant:

void bitset_container_printf_as_uint32_array(const bitset_container_t * v, uint32_t base) {
	bool iamfirst = true;// TODO: rework so that this is not necessary yet still readable
	for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
		uint64_t w = v->words[i];
		while (w != 0) {
			uint64_t t = w & (~w + 1);
			int r = __builtin_ctzll(w);
			if(iamfirst) {// predicted to be false
				printf("%u", r + base);
				iamfirst = false;
			} else {
				printf(",%u",r + base);
			}
			w ^= t;
		}
		base += 64;
	}
}